

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver.hpp
# Opt level: O1

type __thiscall
asio::ip::basic_resolver<asio::ip::tcp,asio::ip::resolver_service<asio::ip::tcp>>::
async_resolve<mau::ProxySession::Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)::__0>
          (basic_resolver<asio::ip::tcp,asio::ip::resolver_service<asio::ip::tcp>> *this,
          string *host,string *service,anon_class_8_1_8991fb9c *handler)

{
  int *piVar1;
  long lVar2;
  long *plVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  int iVar6;
  resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13)>
  *prVar7;
  error_category *peVar8;
  allocator_type a;
  thread_info_base *this_thread;
  long in_FS_OFFSET;
  basic_resolver_query<asio::ip::tcp> q;
  ptr local_c0;
  io_context_impl *local_a8;
  basic_resolver_query<asio::ip::tcp> local_a0;
  
  this_thread = (thread_info_base *)0x0;
  basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            (&local_a0,host,
             &mau::ProxySession::
              Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)
              ::kAnyProtocolStr_abi_cxx11_,0);
  lVar2 = *(long *)this;
  if (*(long *)(in_FS_OFFSET + -8) != 0) {
    this_thread = *(thread_info_base **)(*(long *)(in_FS_OFFSET + -8) + 8);
  }
  local_c0.h = (anon_class_8_1_8991fb9c *)service;
  prVar7 = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13)>
            *)detail::thread_info_base::allocate(this_thread,0xc0);
  local_c0.p = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13)>
                *)0x0;
  peVar4 = *(element_type **)(this + 8);
  p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x10);
  plVar3 = *(long **)(this + 0x10);
  if (plVar3 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)((long)plVar3 + 0xc) = *(int *)((long)plVar3 + 0xc) + 1;
      UNLOCK();
    }
    else {
      *(int *)((long)plVar3 + 0xc) = *(int *)((long)plVar3 + 0xc) + 1;
    }
  }
  local_a8 = ((resolver_service_base *)(lVar2 + 0x28))->io_context_impl_;
  (prVar7->super_operation).next_ = (scheduler_operation *)0x0;
  (prVar7->super_operation).func_ =
       detail::
       resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:532:13)>
       ::do_complete;
  (prVar7->super_operation).task_result_ = 0;
  (prVar7->cancel_token_).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  (prVar7->cancel_token_).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var5;
  if (plVar3 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)((long)plVar3 + 0xc) = *(int *)((long)plVar3 + 0xc) + 1;
      UNLOCK();
    }
    else {
      *(int *)((long)plVar3 + 0xc) = *(int *)((long)plVar3 + 0xc) + 1;
    }
  }
  (prVar7->query_).hints_.ai_addrlen = local_a0.hints_.ai_addrlen;
  *(undefined4 *)&(prVar7->query_).hints_.field_0x14 = local_a0.hints_._20_4_;
  (prVar7->query_).hints_.ai_addr = local_a0.hints_.ai_addr;
  (prVar7->query_).hints_.ai_canonname = local_a0.hints_.ai_canonname;
  (prVar7->query_).hints_.ai_next = local_a0.hints_.ai_next;
  (prVar7->query_).hints_.ai_flags = local_a0.hints_.ai_flags;
  (prVar7->query_).hints_.ai_family = local_a0.hints_.ai_family;
  (prVar7->query_).hints_.ai_socktype = local_a0.hints_.ai_socktype;
  (prVar7->query_).hints_.ai_protocol = local_a0.hints_.ai_protocol;
  (prVar7->query_).hints_.ai_addrlen = local_a0.hints_.ai_addrlen;
  *(undefined4 *)&(prVar7->query_).hints_.field_0x14 = local_a0.hints_._20_4_;
  (prVar7->query_).hints_.ai_addr = local_a0.hints_.ai_addr;
  (prVar7->query_).host_name_._M_dataplus._M_p = (pointer)&(prVar7->query_).host_name_.field_2;
  local_c0.v = prVar7;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(prVar7->query_).host_name_,local_a0.host_name_._M_dataplus._M_p,
             local_a0.host_name_._M_dataplus._M_p + local_a0.host_name_._M_string_length);
  (prVar7->query_).service_name_._M_dataplus._M_p = (pointer)&(prVar7->query_).service_name_.field_2
  ;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(prVar7->query_).service_name_,local_a0.service_name_._M_dataplus._M_p,
             local_a0.service_name_._M_dataplus._M_p + local_a0.service_name_._M_string_length);
  prVar7->io_context_impl_ = local_a8;
  (prVar7->handler_).this = (ProxySession *)(service->_M_dataplus)._M_p;
  (prVar7->ec_)._M_value = 0;
  peVar8 = (error_category *)std::_V2::system_category();
  (prVar7->ec_)._M_cat = peVar8;
  prVar7->addrinfo_ = (addrinfo_type *)0x0;
  local_c0.p = prVar7;
  if (plVar3 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar1 = (int *)((long)plVar3 + 0xc);
      iVar6 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
    }
    else {
      iVar6 = *(int *)((long)plVar3 + 0xc);
      *(int *)((long)plVar3 + 0xc) = iVar6 + -1;
    }
    if (iVar6 == 1) {
      (**(code **)(*plVar3 + 0x18))(plVar3);
    }
  }
  detail::resolver_service_base::start_resolve_op
            ((resolver_service_base *)(lVar2 + 0x28),&(local_c0.p)->super_operation);
  local_c0.v = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13)>
                *)0x0;
  local_c0.p = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13)>
                *)0x0;
  detail::
  resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:532:13)>
  ::ptr::reset(&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.service_name_._M_dataplus._M_p != &local_a0.service_name_.field_2) {
    operator_delete(local_a0.service_name_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.host_name_._M_dataplus._M_p != &local_a0.host_name_.field_2) {
    operator_delete(local_a0.host_name_._M_dataplus._M_p);
  }
  return;
}

Assistant:

async_resolve(const std::string& host, const std::string& service,
      ASIO_MOVE_ARG(ResolveHandler) handler)
  {
    return async_resolve(host, service, resolver_base::flags(),
        ASIO_MOVE_CAST(ResolveHandler)(handler));
  }